

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O0

void __thiscall
pfd::internal::executor::start_process
          (executor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  back_insert_iterator<std::vector<char_*,_std::allocator<char_*>_>_> bVar6;
  reference ppcVar7;
  char **__argv;
  undefined1 *in_RDI;
  int flags;
  vector<char_*,_std::allocator<char_*>_> args;
  int fd;
  int out [2];
  int in [2];
  vector<char_*,_std::allocator<char_*>_> *in_stack_ffffffffffffff48;
  executor *in_stack_ffffffffffffff50;
  value_type __file;
  vector<char_*,_std::allocator<char_*>_> local_40;
  int local_24;
  int local_20 [8];
  
  stop(in_stack_ffffffffffffff50);
  std::__cxx11::string::clear();
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  iVar1 = pipe(local_20 + 2);
  if ((iVar1 == 0) && (iVar1 = pipe(local_20), iVar1 == 0)) {
    _Var2 = fork();
    *(__pid_t *)(in_RDI + 0x2c) = _Var2;
    if (-1 < *(int *)(in_RDI + 0x2c)) {
      close(local_20[(long)(int)(uint)(*(int *)(in_RDI + 0x2c) == 0) + 2]);
      close(local_20[(int)(uint)(*(int *)(in_RDI + 0x2c) != 0)]);
      if (*(int *)(in_RDI + 0x2c) == 0) {
        dup2(local_20[2],0);
        dup2(local_20[1],1);
        local_24 = open("/dev/null",1);
        dup2(local_24,2);
        close(local_24);
        std::vector<char_*,_std::allocator<char_*>_>::vector
                  ((vector<char_*,_std::allocator<char_*>_> *)0x14f059);
        cVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::cbegin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_ffffffffffffff48);
        cVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::cend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff48);
        bVar6 = std::back_inserter<std::vector<char*,std::allocator<char*>>>
                          (in_stack_ffffffffffffff48);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>,pfd::internal::executor::start_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_>
                  (cVar4._M_current,cVar5._M_current,bVar6.container);
        std::vector<char_*,_std::allocator<char_*>_>::push_back
                  ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff50,
                   (value_type *)in_stack_ffffffffffffff48);
        ppcVar7 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&local_40,0);
        __file = *ppcVar7;
        __argv = std::vector<char_*,_std::allocator<char_*>_>::data
                           ((vector<char_*,_std::allocator<char_*>_> *)0x14f0f7);
        execvp(__file,__argv);
        exit(1);
      }
      close(local_20[3]);
      *(int *)(in_RDI + 0x30) = local_20[0];
      uVar3 = fcntl(*(int *)(in_RDI + 0x30),3);
      fcntl(*(int *)(in_RDI + 0x30),4,(ulong)(uVar3 | 0x800));
      *in_RDI = 1;
    }
  }
  return;
}

Assistant:

inline void internal::executor::start_process(std::vector<std::string> const &command)
{
    stop();
    m_stdout.clear();
    m_exit_code = -1;

    int in[2], out[2];
    if (pipe(in) != 0 || pipe(out) != 0)
        return;

    m_pid = fork();
    if (m_pid < 0)
        return;

    close(in[m_pid ? 0 : 1]);
    close(out[m_pid ? 1 : 0]);

    if (m_pid == 0)
    {
        dup2(in[0], STDIN_FILENO);
        dup2(out[1], STDOUT_FILENO);

        // Ignore stderr so that it doesn’t pollute the console (e.g. GTK+ errors from zenity)
        int fd = open("/dev/null", O_WRONLY);
        dup2(fd, STDERR_FILENO);
        close(fd);

        std::vector<char *> args;
        std::transform(command.cbegin(), command.cend(), std::back_inserter(args),
                       [](std::string const &s) { return const_cast<char *>(s.c_str()); });
        args.push_back(nullptr); // null-terminate argv[]

        execvp(args[0], args.data());
        exit(1);
    }

    close(in[1]);
    m_fd = out[0];
    auto flags = fcntl(m_fd, F_GETFL);
    fcntl(m_fd, F_SETFL, flags | O_NONBLOCK);

    m_running = true;
}